

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

bool __thiscall
banksia::ChessBoard::isLegalMove(ChessBoard *this,int from,int dest,PieceType promotion)

{
  bool bVar1;
  Piece PVar2;
  Piece PVar3;
  PieceType in_R9D;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moveList;
  _Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> local_48;
  
  if (((uint)(dest | from) < 0x40 && from != dest) &&
     (PVar2 = BoardCore::getPiece(&this->super_BoardCore,from), PVar2.type != empty)) {
    PVar3 = BoardCore::getPiece(&this->super_BoardCore,dest);
    if ((PVar2.side != PVar3.side) && (bVar1 = BoardCore::isValidPromotion(promotion), bVar1)) {
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      genLegal(this,(vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)&local_48,
               PVar2.side,from,dest,in_R9D);
      bVar1 = local_48._M_impl.super__Vector_impl_data._M_start !=
              local_48._M_impl.super__Vector_impl_data._M_finish;
      std::_Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::~_Vector_base
                (&local_48);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ChessBoard::isLegalMove(int from, int dest, PieceType promotion)
{
    if (!MoveFull::isValid(from, dest)) {
        return false;
    }
    auto piece = getPiece(from);
    if (piece.isEmpty()
        || piece.side == getPiece(dest).side
        || !isValidPromotion(promotion)) {
        return false;
    }
    
    std::vector<MoveFull> moveList;
    genLegal(moveList, piece.side, from, dest, promotion);
    return !moveList.empty();
}